

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::EnumValueDescriptorProto::ByteSize(EnumValueDescriptorProto *this)

{
  bool bVar1;
  int32 value;
  int iVar2;
  string *value_00;
  EnumValueOptions *value_01;
  UnknownFieldSet *pUVar3;
  int local_14;
  int total_size;
  EnumValueDescriptorProto *this_local;
  
  local_14 = 0;
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      value_00 = name_abi_cxx11_(this);
      local_14 = internal::WireFormatLite::StringSize(value_00);
      local_14 = local_14 + 1;
    }
    bVar1 = has_number(this);
    if (bVar1) {
      value = number(this);
      iVar2 = internal::WireFormatLite::Int32Size(value);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_options(this);
    if (bVar1) {
      value_01 = options(this);
      iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumValueOptions>
                        (value_01);
      local_14 = iVar2 + 1 + local_14;
    }
  }
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar3);
    local_14 = iVar2 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int EnumValueDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional int32 number = 2;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

    // optional .google.protobuf.EnumValueOptions options = 3;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}